

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap1.c
# Opt level: O2

void Cffgiou(int *unit,int *status)

{
  long lVar1;
  
  if (0 < *status) {
    return;
  }
  lVar1 = 0x32;
  while( true ) {
    if (lVar1 == 10000) {
      *unit = 0;
      *status = 0x67;
      ffpmsg("Cffgiou has no more available unit numbers.");
      return;
    }
    if (gFitsFiles[lVar1] == (fitsfile *)0x0) break;
    lVar1 = lVar1 + 1;
  }
  *unit = (int)lVar1;
  gFitsFiles[lVar1] = (fitsfile *)0x1;
  return;
}

Assistant:

void Cffgiou( int *unit, int *status )
{
   int i;

   if( *status>0 ) return;
   FFLOCK;
   for( i=50;i<NMAXFILES;i++ ) /* Using a unit=0 sounds bad, so start at 1 */
      if( gFitsFiles[i]==NULL ) break;
   if( i==NMAXFILES ) {
      *unit = 0;
      *status = TOO_MANY_FILES;
      ffpmsg("Cffgiou has no more available unit numbers.");
   } else {
      *unit=i;
      gFitsFiles[i] = (fitsfile *)1; /*  Flag it as taken until ftopen/init  */
                                     /*  can be called and set a real value  */
   }
   FFUNLOCK;
}